

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O3

void __thiscall
TypeArray::TypeArray(TypeArray *this,InplaceStr name,TypeBase *subType,longlong length)

{
  uint uVar1;
  
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (this->super_TypeBase).typeID = 0x13;
  (this->super_TypeBase).name.begin = name.begin;
  (this->super_TypeBase).name.end = name.end;
  (this->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (this->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar1 = NULLC::GetStringHash(name.begin,name.end);
  (this->super_TypeBase).nameHash = uVar1;
  (this->super_TypeBase).importModule = (ModuleData *)0x0;
  (this->super_TypeBase).typeIndex = 0xffffffff;
  (this->super_TypeBase).refType = (TypeRef *)0x0;
  (this->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(this->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(this->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(this->super_TypeBase).padding + 3) = 0;
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_002237d8;
  this->subType = subType;
  this->length = length;
  (this->super_TypeBase).size = length * subType->size;
  (this->super_TypeBase).isGeneric = subType->isGeneric;
  (this->super_TypeBase).hasPointers = subType->hasPointers;
  return;
}

Assistant:

TypeArray(InplaceStr name, TypeBase *subType, long long length): TypeBase(myTypeID, name), subType(subType), length(length)
	{
		size = subType->size * length;

		isGeneric = subType->isGeneric;

		hasPointers = subType->hasPointers;
	}